

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O2

void __thiscall
wavingz::demod::state_machine::sample_sm::lead_in_t::process
          (lead_in_t *this,sample_sm_t *ctx,optional<bool> *sample)

{
  bool bVar1;
  pointer __p_2;
  reference_const_type pbVar2;
  size_t sVar3;
  pointer psVar4;
  pointer __p;
  __uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::preamble_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>_>
  local_40;
  __uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
  local_38;
  
  if ((sample->super_type).m_initialized == false) {
    psVar4 = (pointer)operator_new(8);
    psVar4->_vptr_state_base_t = (_func_int **)&PTR_process_0011ed10;
    local_40._M_t.
    super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::preamble_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>_>
    .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::preamble_t_*,_false>.
    _M_head_impl = (tuple<wavingz::demod::state_machine::sample_sm::preamble_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>_>
                    )(_Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::preamble_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>_>
                      )0x0;
    local_38._M_t.
    super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
    _M_head_impl = (tuple<wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
                    )(_Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
                      )0x0;
    std::
    __uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    ::reset((__uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
             *)&ctx->current_state_m,psVar4);
    std::
    unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    ::~unique_ptr((unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
                   *)&local_38);
    std::
    unique_ptr<wavingz::demod::state_machine::sample_sm::idle_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>_>
    ::~unique_ptr((unique_ptr<wavingz::demod::state_machine::sample_sm::idle_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::idle_t>_>
                   *)&local_40);
  }
  else {
    pbVar2 = boost::optional<bool>::get(sample);
    if ((*pbVar2 != this->last_sample) &&
       (sVar3 = this->counter + 1, this->counter = sVar3, sVar3 == 10)) {
      psVar4 = (pointer)operator_new(0x20);
      pbVar2 = boost::optional<bool>::get(sample);
      bVar1 = *pbVar2;
      psVar4->_vptr_state_base_t = (_func_int **)&PTR_process_0011ec50;
      psVar4[1]._vptr_state_base_t = (_func_int **)0x0;
      psVar4[2]._vptr_state_base_t = (_func_int **)0x0;
      *(bool *)&psVar4[3]._vptr_state_base_t = bVar1;
      local_40._M_t.
      super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::preamble_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>_>
      .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::preamble_t_*,_false>.
      _M_head_impl = (tuple<wavingz::demod::state_machine::sample_sm::preamble_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>_>
                      )(_Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::preamble_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>_>
                        )0x0;
      local_38._M_t.
      super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
      .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
      _M_head_impl = (tuple<wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
                      )(_Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
                        )0x0;
      std::
      __uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
      ::reset((__uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
               *)&ctx->current_state_m,psVar4);
      std::
      unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
      ::~unique_ptr((unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
                     *)&local_38);
      std::
      unique_ptr<wavingz::demod::state_machine::sample_sm::preamble_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>_>
      ::~unique_ptr((unique_ptr<wavingz::demod::state_machine::sample_sm::preamble_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::preamble_t>_>
                     *)&local_40);
    }
    pbVar2 = boost::optional<bool>::get(sample);
    this->last_sample = *pbVar2;
  }
  return;
}

Assistant:

void
lead_in_t::process(sample_sm_t& ctx, const boost::optional<bool>& sample)
{
    const size_t LEAD_IN_SYMBOLS = 10;

    // On no signal, return to idle
    if (sample == boost::none)
    {
        ctx.state(std::unique_ptr<idle_t>(new idle_t()));
    }
    else
    {
        // skip the first few samples to synchronize
        if (*sample != last_sample)
        {
            if (++counter == LEAD_IN_SYMBOLS)
            {
                ctx.state(std::unique_ptr<preamble_t>(new preamble_t(*sample)));
            }
        }
        last_sample = *sample;
    }
}